

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O0

FormatArgumentList * __thiscall
deqp::gles2::Functional::anon_unknown_1::FormatArgumentList::operator<<
          (FormatArgumentList *this,FormatArgument *arg)

{
  char *__s;
  mapped_type *this_00;
  allocator<char> local_39;
  key_type local_38;
  FormatArgument *local_18;
  FormatArgument *arg_local;
  FormatArgumentList *this_local;
  
  __s = arg->m_name;
  local_18 = arg;
  arg_local = (FormatArgument *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_formatArguments,&local_38);
  std::__cxx11::string::operator=((string *)this_00,(string *)&arg->m_value);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return this;
}

Assistant:

FormatArgumentList&	FormatArgumentList::operator<< (const FormatArgument& arg)
{
	m_formatArguments[arg.m_name] = arg.m_value;
	return *this;
}